

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_non_terminals.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::
array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
::begin_array(array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  **in_RCX;
  undefined1 local_50 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [4];
  code *local_20;
  undefined8 local_18;
  
  local_20 = rule::
             replace_top<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
  ;
  local_18 = 0;
  local_50._0_8_ = this;
  std::
  __tuple_concater<std::tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>,std::_Index_tuple<0ul,1ul,2ul>,std::tuple<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>&>
  ::
  _S_do<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>*>
            ((tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              *)(local_50 + 8),
             (__tuple_concater<std::tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>,std::_Index_tuple<0ul,1ul,2ul>,std::tuple<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>&>
              *)&this->args_,
             (tuple<std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              *)local_50,in_RCX);
  cxx17shim::details::
  apply_impl<std::error_code(pstore::exchange::import_ns::rule::*)(std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>),std::tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>,0ul,1ul,2ul,3ul>
            (&local_20,
             (tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
  uVar2 = std::_V2::system_category();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

std::error_code begin_array () override {
                    cxx17shim::apply (&array_rule::replace_top<NextRule, Args...>,
                                      std::tuple_cat (std::make_tuple (this), args_));
                    return {};
                }